

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O2

ImplicitProducer * __thiscall
ylt::detail::moodycamel::
ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
::get_or_add_implicit_producer
          (ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
           *this)

{
  uint64_t h;
  undefined8 *puVar1;
  atomic<unsigned_long> *paVar2;
  __atomic_flag_data_type _Var3;
  __int_type _Var4;
  uint64_t uVar5;
  __pointer_type pIVar6;
  uint64_t uVar7;
  ImplicitProducerHash *pIVar8;
  __pointer_type pIVar9;
  long lVar10;
  ImplicitProducer *pIVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint64_t uVar15;
  long *in_FS_OFFSET;
  bool bVar16;
  
  h = *in_FS_OFFSET - 0x1e0;
  uVar7 = details::_hash_32_or_64<true>::hash(h);
  pIVar9 = (this->implicitProducerHash)._M_b._M_p;
  pIVar8 = pIVar9;
  do {
    if (pIVar8 == (__pointer_type)0x0) {
      LOCK();
      paVar2 = &this->implicitProducerHashCount;
      _Var4 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      uVar14 = _Var4 + 1;
      while( true ) {
        if (pIVar9->capacity >> 1 <= uVar14) {
          LOCK();
          _Var3 = (this->implicitProducerHashResizeInProgress).super___atomic_flag_base._M_i;
          (this->implicitProducerHashResizeInProgress).super___atomic_flag_base._M_i = true;
          UNLOCK();
          if (_Var3 == false) {
            pIVar6 = (this->implicitProducerHash)._M_b._M_p;
            uVar13 = pIVar6->capacity;
            pIVar9 = pIVar6;
            if (pIVar6->capacity >> 1 <= uVar14) {
              do {
                uVar12 = uVar13;
                uVar13 = uVar12 * 2;
              } while ((uVar12 & 0x7fffffffffffffff) <= uVar14);
              pIVar9 = (__pointer_type)malloc(uVar12 << 5 | 0x1f);
              if (pIVar9 == (__pointer_type)0x0) {
                LOCK();
                (this->implicitProducerHashCount).super___atomic_base<unsigned_long>._M_i =
                     (this->implicitProducerHashCount).super___atomic_base<unsigned_long>._M_i - 1;
                UNLOCK();
                (this->implicitProducerHashResizeInProgress).super___atomic_flag_base._M_i = false;
                return (ImplicitProducer *)0x0;
              }
              pIVar9->capacity = uVar13;
              pIVar9->entries =
                   (ImplicitProducerKVP *)
                   ((long)&pIVar9[1].capacity + (ulong)(-((int)pIVar9 + 0x18) & 7));
              lVar10 = 0;
              while (bVar16 = uVar13 != 0, uVar13 = uVar13 - 1, bVar16) {
                puVar1 = (undefined8 *)
                         ((long)&(pIVar9->entries->key).super___atomic_base<unsigned_long>._M_i +
                         lVar10);
                *puVar1 = 0;
                puVar1[1] = 0;
                *(undefined8 *)
                 ((long)&(pIVar9->entries->key).super___atomic_base<unsigned_long>._M_i + lVar10) =
                     0;
                lVar10 = lVar10 + 0x10;
              }
              pIVar9->prev = pIVar6;
              (this->implicitProducerHash)._M_b._M_p = pIVar9;
            }
            (this->implicitProducerHashResizeInProgress).super___atomic_flag_base._M_i = false;
          }
        }
        if (uVar14 < (pIVar9->capacity >> 2) + (pIVar9->capacity >> 1)) break;
        pIVar9 = (this->implicitProducerHash)._M_b._M_p;
      }
      pIVar11 = (ImplicitProducer *)recycle_or_create_producer(this,false);
      if (pIVar11 == (ImplicitProducer *)0x0) {
        LOCK();
        (this->implicitProducerHashCount).super___atomic_base<unsigned_long>._M_i =
             (this->implicitProducerHashCount).super___atomic_base<unsigned_long>._M_i - 1;
        UNLOCK();
        return (ImplicitProducer *)0x0;
      }
      do {
        uVar14 = pIVar9->capacity - 1 & uVar7;
        uVar7 = uVar14 + 1;
        LOCK();
        bVar16 = pIVar9->entries[uVar14].key.super___atomic_base<unsigned_long>._M_i == 0;
        if (bVar16) {
          pIVar9->entries[uVar14].key.super___atomic_base<unsigned_long>._M_i = h;
        }
        UNLOCK();
      } while (!bVar16);
LAB_001bfebc:
      pIVar9->entries[uVar14].value = pIVar11;
      return pIVar11;
    }
    uVar15 = uVar7;
    do {
      uVar14 = uVar15 & pIVar8->capacity - 1;
      uVar5 = pIVar8->entries[uVar14].key.super___atomic_base<unsigned_long>._M_i;
      if (uVar5 == h) {
        pIVar11 = pIVar8->entries[uVar14].value;
        if (pIVar8 == pIVar9) {
          return pIVar11;
        }
        do {
          uVar14 = pIVar9->capacity - 1 & uVar7;
          uVar7 = uVar14 + 1;
          LOCK();
          bVar16 = pIVar9->entries[uVar14].key.super___atomic_base<unsigned_long>._M_i == 0;
          if (bVar16) {
            pIVar9->entries[uVar14].key.super___atomic_base<unsigned_long>._M_i = h;
          }
          UNLOCK();
        } while (!bVar16);
        goto LAB_001bfebc;
      }
      uVar15 = uVar14 + 1;
    } while (uVar5 != 0);
    pIVar8 = pIVar8->prev;
  } while( true );
}

Assistant:

ImplicitProducer* get_or_add_implicit_producer() {
    // Note that since the data is essentially thread-local (key is thread ID),
    // there's a reduced need for fences (memory ordering is already consistent
    // for any individual thread), except for the current table itself.

    // Start by looking for the thread ID in the current and all previous hash
    // tables. If it's not found, it must not be in there yet, since this same
    // thread would have added it previously to one of the tables that we
    // traversed.

    // Code and algorithm adapted from
    // http://preshing.com/20130605/the-worlds-simplest-lock-free-hash-table

#ifdef MCDBGQ_NOLOCKFREE_IMPLICITPRODHASH
    debug::DebugLock lock(implicitProdMutex);
#endif

    auto id = details::thread_id();
    auto hashedId = details::hash_thread_id(id);

    auto mainHash = implicitProducerHash.load(std::memory_order_acquire);
    assert(
        mainHash !=
        nullptr);  // silence clang-tidy and MSVC warnings (hash cannot be null)
    for (auto hash = mainHash; hash != nullptr; hash = hash->prev) {
      // Look for the id in this hash
      auto index = hashedId;
      while (true) {  // Not an infinite loop because at least one slot is free
                      // in the hash table
        index &= hash->capacity - 1u;

        auto probedKey =
            hash->entries[index].key.load(std::memory_order_relaxed);
        if (probedKey == id) {
          // Found it! If we had to search several hashes deep, though, we
          // should lazily add it to the current main hash table to avoid the
          // extended search next time. Note there's guaranteed to be room in
          // the current hash table since every subsequent table implicitly
          // reserves space for all previous tables (there's only one
          // implicitProducerHashCount).
          auto value = hash->entries[index].value;
          if (hash != mainHash) {
            index = hashedId;
            while (true) {
              index &= mainHash->capacity - 1u;
              auto empty = details::invalid_thread_id;
#ifdef MOODYCAMEL_CPP11_THREAD_LOCAL_SUPPORTED
              auto reusable = details::invalid_thread_id2;
              if (mainHash->entries[index].key.compare_exchange_strong(
                      empty, id, std::memory_order_seq_cst,
                      std::memory_order_relaxed) ||
                  mainHash->entries[index].key.compare_exchange_strong(
                      reusable, id, std::memory_order_seq_cst,
                      std::memory_order_relaxed)) {
#else
              if (mainHash->entries[index].key.compare_exchange_strong(
                      empty, id, std::memory_order_seq_cst,
                      std::memory_order_relaxed)) {
#endif
                mainHash->entries[index].value = value;
                break;
              }
              ++index;
            }
          }

          return value;
        }
        if (probedKey == details::invalid_thread_id) {
          break;  // Not in this hash table
        }
        ++index;
      }
    }

    // Insert!
    auto newCount =
        1 + implicitProducerHashCount.fetch_add(1, std::memory_order_relaxed);
    while (true) {
      // NOLINTNEXTLINE(clang-analyzer-core.NullDereference)
      if (newCount >= (mainHash->capacity >> 1) &&
          !implicitProducerHashResizeInProgress.test_and_set(
              std::memory_order_acquire)) {
        // We've acquired the resize lock, try to allocate a bigger hash table.
        // Note the acquire fence synchronizes with the release fence at the end
        // of this block, and hence when we reload implicitProducerHash it must
        // be the most recent version (it only gets changed within this locked
        // block).
        mainHash = implicitProducerHash.load(std::memory_order_acquire);
        if (newCount >= (mainHash->capacity >> 1)) {
          size_t newCapacity = mainHash->capacity << 1;
          while (newCount >= (newCapacity >> 1)) {
            newCapacity <<= 1;
          }
          auto raw = static_cast<char*>(
              (Traits::malloc)(sizeof(ImplicitProducerHash) +
                               std::alignment_of<ImplicitProducerKVP>::value -
                               1 + sizeof(ImplicitProducerKVP) * newCapacity));
          if (raw == nullptr) {
            // Allocation failed
            implicitProducerHashCount.fetch_sub(1, std::memory_order_relaxed);
            implicitProducerHashResizeInProgress.clear(
                std::memory_order_relaxed);
            return nullptr;
          }

          auto newHash = new (raw) ImplicitProducerHash;
          newHash->capacity = static_cast<size_t>(newCapacity);
          newHash->entries = reinterpret_cast<ImplicitProducerKVP*>(
              details::align_for<ImplicitProducerKVP>(
                  raw + sizeof(ImplicitProducerHash)));
          for (size_t i = 0; i != newCapacity; ++i) {
            new (newHash->entries + i) ImplicitProducerKVP;
            newHash->entries[i].key.store(details::invalid_thread_id,
                                          std::memory_order_relaxed);
          }
          newHash->prev = mainHash;
          implicitProducerHash.store(newHash, std::memory_order_release);
          implicitProducerHashResizeInProgress.clear(std::memory_order_release);
          mainHash = newHash;
        }
        else {
          implicitProducerHashResizeInProgress.clear(std::memory_order_release);
        }
      }

      // If it's < three-quarters full, add to the old one anyway so that we
      // don't have to wait for the next table to finish being allocated by
      // another thread (and if we just finished allocating above, the condition
      // will always be true)
      if (newCount < (mainHash->capacity >> 1) + (mainHash->capacity >> 2)) {
        auto producer =
            static_cast<ImplicitProducer*>(recycle_or_create_producer(false));
        if (producer == nullptr) {
          implicitProducerHashCount.fetch_sub(1, std::memory_order_relaxed);
          return nullptr;
        }

#ifdef MOODYCAMEL_CPP11_THREAD_LOCAL_SUPPORTED
        producer->threadExitListener.callback =
            &ConcurrentQueue::implicit_producer_thread_exited_callback;
        producer->threadExitListener.userData = producer;
        details::ThreadExitNotifier::subscribe(&producer->threadExitListener);
#endif

        auto index = hashedId;
        while (true) {
          index &= mainHash->capacity - 1u;
          auto empty = details::invalid_thread_id;
#ifdef MOODYCAMEL_CPP11_THREAD_LOCAL_SUPPORTED
          auto reusable = details::invalid_thread_id2;
          if (mainHash->entries[index].key.compare_exchange_strong(
                  reusable, id, std::memory_order_seq_cst,
                  std::memory_order_relaxed)) {
            implicitProducerHashCount.fetch_sub(
                1,
                std::memory_order_relaxed);  // already counted as a used slot
            mainHash->entries[index].value = producer;
            break;
          }
#endif
          if (mainHash->entries[index].key.compare_exchange_strong(
                  empty, id, std::memory_order_seq_cst,
                  std::memory_order_relaxed)) {
            mainHash->entries[index].value = producer;
            break;
          }
          ++index;
        }
        return producer;
      }

      // Hmm, the old hash is quite full and somebody else is busy allocating a
      // new one. We need to wait for the allocating thread to finish (if it
      // succeeds, we add, if not, we try to allocate ourselves).
      mainHash = implicitProducerHash.load(std::memory_order_acquire);
    }
  }

#ifdef MOODYCAMEL_CPP11_THREAD_LOCAL_SUPPORTED
  void implicit_producer_thread_exited(ImplicitProducer* producer) {
    // Remove from hash
#ifdef MCDBGQ_NOLOCKFREE_IMPLICITPRODHASH
    debug::DebugLock lock(implicitProdMutex);
#endif
    auto hash = implicitProducerHash.load(std::memory_order_acquire);
    assert(hash != nullptr);  // The thread exit listener is only registered if
                              // we were added to a hash in the first place
    auto id = details::thread_id();
    auto hashedId = details::hash_thread_id(id);
    details::thread_id_t probedKey;

    // We need to traverse all the hashes just in case other threads aren't on
    // the current one yet and are trying to add an entry thinking there's a
    // free slot (because they reused a producer)
    for (; hash != nullptr; hash = hash->prev) {
      auto index = hashedId;
      do {
        index &= hash->capacity - 1u;
        probedKey = id;
        if (hash->entries[index].key.compare_exchange_strong(
                probedKey, details::invalid_thread_id2,
                std::memory_order_seq_cst, std::memory_order_relaxed)) {
          break;
        }
        ++index;
      } while (
          probedKey !=
          details::invalid_thread_id);  // Can happen if the hash has changed
                                        // but we weren't put back in it yet, or
                                        // if we weren't added to this hash in
                                        // the first place
    }

    // Mark the queue as being recyclable
    producer->inactive.store(true, std::memory_order_release);
  }

  static void implicit_producer_thread_exited_callback(void* userData) {
    auto producer = static_cast<ImplicitProducer*>(userData);
    auto queue = producer->parent;
    queue->implicit_producer_thread_exited(producer);
  }
#endif

  //////////////////////////////////
  // Utility functions
  //////////////////////////////////

  template <typename TAlign>
  static inline void* aligned_malloc(size_t size) {
    MOODYCAMEL_CONSTEXPR_IF(std::alignment_of<TAlign>::value <=
                            std::alignment_of<details::max_align_t>::value)
    return (Traits::malloc)(size);
    else {
      size_t alignment = std::alignment_of<TAlign>::value;
      void* raw = (Traits::malloc)(size + alignment - 1 + sizeof(void*));
      if (!raw)
        return nullptr;
      char* ptr = details::align_for<TAlign>(reinterpret_cast<char*>(raw) +
                                             sizeof(void*));
      *(reinterpret_cast<void**>(ptr) - 1) = raw;
      return ptr;
    }
  }